

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O0

void __thiscall
spdlog::details::thread_pool::thread_pool
          (thread_pool *this,size_t q_max_items,size_t threads_n,function<void_()> *on_thread_start,
          function<void_()> *on_thread_stop)

{
  function<void_()> *in_RCX;
  _Invoker_type in_RDX;
  mpmc_blocking_queue<spdlog::details::async_msg> *in_RDI;
  size_t in_R8;
  size_t i;
  type *this_00;
  type *in_stack_ffffffffffffff28;
  allocator *paVar1;
  undefined8 in_stack_ffffffffffffff60;
  _Invoker_type local_68;
  allocator local_49;
  string local_48 [48];
  _Invoker_type local_18;
  
  local_18 = in_RDX;
  mpmc_blocking_queue<spdlog::details::async_msg>::mpmc_blocking_queue(in_RDI,in_R8);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1adbd9);
  if ((local_18 != (_Invoker_type)0x0) && (local_18 < (_Invoker_type)0x3e9)) {
    for (local_68 = (_Invoker_type)0x0; local_68 < local_18; local_68 = local_68 + 1) {
      this_00 = (type *)&stack0xffffffffffffff58;
      std::function<void_()>::function(in_RCX,(function<void_()> *)in_stack_ffffffffffffff28);
      std::function<void_()>::function(in_RCX,(function<void_()> *)in_stack_ffffffffffffff28);
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<spdlog::details::thread_pool::thread_pool(unsigned_long,unsigned_long,std::function<void()>,std::function<void()>)::__0>
                ((vector<std::thread,_std::allocator<std::thread>_> *)in_RCX,
                 in_stack_ffffffffffffff28);
      thread_pool(unsigned_long,unsigned_long,std::function<void()>,std::function<void()>)::$_0::
      ~__0(this_00);
    }
    return;
  }
  paVar1 = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"spdlog::thread_pool(): invalid threads_n param (valid range is 1-1000)",
             paVar1);
  throw_spdlog_ex((string *)in_stack_ffffffffffffff60);
}

Assistant:

SPDLOG_INLINE thread_pool::thread_pool(
    size_t q_max_items, size_t threads_n, std::function<void()> on_thread_start, std::function<void()> on_thread_stop)
    : q_(q_max_items)
{
    if (threads_n == 0 || threads_n > 1000)
    {
        throw_spdlog_ex("spdlog::thread_pool(): invalid threads_n param (valid "
                        "range is 1-1000)");
    }
    for (size_t i = 0; i < threads_n; i++)
    {
        threads_.emplace_back([this, on_thread_start, on_thread_stop] {
            on_thread_start();
            this->thread_pool::worker_loop_();
            on_thread_stop();
        });
    }
}